

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O1

double __thiscall ON_BinaryArchive::Internal_ArchiveModelSpaceTextScale(ON_BinaryArchive *this)

{
  bool bVar1;
  double x;
  double local_18;
  
  x = 1.0;
  local_18 = 1.0;
  if (this->m_archive_3dm_settings != (ON_3dmSettings *)0x0) {
    bVar1 = ON_3dmAnnotationSettings::Is_V5_AnnotationScalingEnabled
                      (&this->m_archive_3dm_settings->m_AnnotationSettings);
    x = 1.0;
    if (bVar1) {
      x = ON_3dmAnnotationSettings::WorldViewTextScale
                    (&this->m_archive_3dm_settings->m_AnnotationSettings);
    }
  }
  if (0.0 < x) {
    bVar1 = ON_IsValid(x);
    if (bVar1) {
      local_18 = x;
    }
  }
  return local_18;
}

Assistant:

double ON_BinaryArchive::Internal_ArchiveModelSpaceTextScale() const
{
  const double default_model_space_text_scale = 1.0;

  const double model_space_text_scale
    = (nullptr != m_archive_3dm_settings && m_archive_3dm_settings->m_AnnotationSettings.Is_V5_AnnotationScalingEnabled())
    ? m_archive_3dm_settings->m_AnnotationSettings.WorldViewTextScale()
    : default_model_space_text_scale;

  return (model_space_text_scale > 0.0 && ON_IsValid(model_space_text_scale)) ? model_space_text_scale : default_model_space_text_scale;
}